

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O2

int_mv get_ref_mv(MACROBLOCK *x,int ref_idx)

{
  MB_MODE_INFO *pMVar1;
  MB_MODE_INFO_EXT_FRAME *pMVar2;
  uint uVar3;
  int_mv *piVar4;
  
  pMVar1 = *(x->e_mbd).mi;
  uVar3 = (*(ushort *)&pMVar1->field_0xa7 >> 4 & 3) + (uint)((byte)(pMVar1->mode - 0x15) < 2);
  pMVar2 = x->mbmi_ext_frame;
  if (pMVar1->ref_frame[1] < '\x01') {
    piVar4 = pMVar2->global_mvs + pMVar1->ref_frame[0];
    if (uVar3 < pMVar2->ref_mv_count) {
      piVar4 = &pMVar2->ref_mv_stack[uVar3].this_mv;
    }
  }
  else {
    piVar4 = &pMVar2->ref_mv_stack[uVar3].comp_mv;
    if (ref_idx == 0) {
      piVar4 = &pMVar2->ref_mv_stack[uVar3].this_mv;
    }
  }
  return (int_mv)(*piVar4).as_int;
}

Assistant:

static inline int_mv get_ref_mv(const MACROBLOCK *x, int ref_idx) {
  const MACROBLOCKD *xd = &x->e_mbd;
  const MB_MODE_INFO *mbmi = xd->mi[0];
  int ref_mv_idx = mbmi->ref_mv_idx;
  if (mbmi->mode == NEAR_NEWMV || mbmi->mode == NEW_NEARMV) {
    assert(has_second_ref(mbmi));
    ref_mv_idx += 1;
  }
  return get_ref_mv_from_stack(ref_idx, mbmi->ref_frame, ref_mv_idx,
                               x->mbmi_ext_frame);
}